

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

void __thiscall wasm::OptimizeInstructions::canonicalize(OptimizeInstructions *this,Binary *binary)

{
  bool bVar1;
  BinaryOp BVar2;
  BinaryOp BVar3;
  int32_t iVar4;
  int64_t iVar5;
  Unary *pUVar6;
  Unary *pUVar7;
  Binary *pBVar8;
  Binary *pBVar9;
  LocalGet *pLVar10;
  LocalGet *pLVar11;
  LocalGet *right_2;
  LocalGet *left_2;
  Binary *right_1;
  Binary *left_1;
  Unary *right;
  Unary *left;
  Literal local_2f8;
  uintptr_t local_2e0;
  uintptr_t local_2d8;
  uintptr_t local_2d0;
  Literal local_2c8;
  uintptr_t local_2b0;
  uintptr_t local_2a8;
  Type local_2a0;
  Literal local_298;
  Type local_280;
  Literal local_278;
  Type local_260;
  Literal local_258;
  Type local_240;
  Literal local_238;
  Type local_220;
  Literal local_218;
  Type local_200;
  Literal local_1f8;
  Type local_1e0;
  Literal local_1d8;
  Type local_1c0;
  Literal local_1b8;
  uintptr_t local_1a0;
  Literal local_198;
  uintptr_t local_180;
  uintptr_t local_178;
  uintptr_t local_170;
  Literal local_168;
  uintptr_t local_150;
  uintptr_t local_148;
  uintptr_t local_140;
  Literal local_138;
  uintptr_t local_120;
  uintptr_t local_118;
  uintptr_t local_110;
  Literal local_108;
  uintptr_t local_f0;
  uintptr_t local_e8;
  uintptr_t local_e0;
  Literal local_d8;
  uintptr_t local_c0;
  uintptr_t local_b8;
  uintptr_t local_b0;
  Literal local_a8;
  uintptr_t local_90;
  uintptr_t local_88;
  uintptr_t local_80;
  Literal local_68;
  uintptr_t local_50;
  Const *local_48;
  Const *c;
  anon_class_24_3_4a829d37 maybeSwap;
  anon_class_16_2_3610dbfc swap;
  Binary *binary_local;
  OptimizeInstructions *this_local;
  
  swap.binary = (Binary **)binary;
  bVar1 = shouldCanonicalize(this,binary);
  if (bVar1) {
    swap.this = (OptimizeInstructions *)&swap.binary;
    maybeSwap.this = (OptimizeInstructions *)&swap.binary;
    maybeSwap.binary = (Binary **)&maybeSwap.swap;
    c = (Const *)this;
    maybeSwap.swap = (anon_class_16_2_3610dbfc *)this;
    bVar1 = Expression::is<wasm::Const>((Expression *)swap.binary[3]);
    if ((bVar1) && (bVar1 = Expression::is<wasm::Const>((Expression *)swap.binary[4]), !bVar1)) {
      canonicalize::anon_class_16_2_3610dbfc::operator()
                ((anon_class_16_2_3610dbfc *)&maybeSwap.swap);
    }
    local_48 = Expression::dynCast<wasm::Const>((Expression *)swap.binary[4]);
    if (local_48 == (Const *)0x0) {
      bVar1 = Expression::is<wasm::LocalGet>((Expression *)swap.binary[3]);
      if ((!bVar1) || (bVar1 = Expression::is<wasm::LocalGet>((Expression *)swap.binary[4]), bVar1))
      {
        if ((swap.binary[3]->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.
            _id == (swap.binary[4]->super_SpecificExpression<(wasm::Expression::Id)16>).
                   super_Expression._id) {
          pUVar6 = Expression::dynCast<wasm::Unary>((Expression *)swap.binary[3]);
          if ((pUVar6 == (Unary *)0x0) ||
             (pUVar7 = Expression::cast<wasm::Unary>((Expression *)swap.binary[4]),
             (int)pUVar6->op <= (int)pUVar7->op)) {
            pBVar8 = Expression::dynCast<wasm::Binary>((Expression *)swap.binary[3]);
            if ((pBVar8 == (Binary *)0x0) ||
               (pBVar9 = Expression::cast<wasm::Binary>((Expression *)swap.binary[4]),
               (int)pBVar8->op <= (int)pBVar9->op)) {
              pLVar10 = Expression::dynCast<wasm::LocalGet>((Expression *)swap.binary[3]);
              if ((pLVar10 != (LocalGet *)0x0) &&
                 (pLVar11 = Expression::cast<wasm::LocalGet>((Expression *)swap.binary[4]),
                 pLVar11->index < pLVar10->index)) {
                canonicalize::anon_class_24_3_4a829d37::operator()((anon_class_24_3_4a829d37 *)&c);
              }
            }
            else {
              canonicalize::anon_class_24_3_4a829d37::operator()((anon_class_24_3_4a829d37 *)&c);
            }
          }
          else {
            canonicalize::anon_class_24_3_4a829d37::operator()((anon_class_24_3_4a829d37 *)&c);
          }
        }
        else if ((swap.binary[4]->super_SpecificExpression<(wasm::Expression::Id)16>).
                 super_Expression._id <
                 (swap.binary[3]->super_SpecificExpression<(wasm::Expression::Id)16>).
                 super_Expression._id) {
          canonicalize::anon_class_24_3_4a829d37::operator()((anon_class_24_3_4a829d37 *)&c);
        }
      }
      else {
        canonicalize::anon_class_24_3_4a829d37::operator()((anon_class_24_3_4a829d37 *)&c);
      }
    }
    else {
      BVar3 = *(BinaryOp *)(swap.binary + 2);
      local_50 = (local_48->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.
                 type.id;
      BVar2 = Abstract::getBinary((Type)local_50,Sub);
      if (BVar3 == BVar2) {
        wasm::Literal::neg(&local_68,&local_48->value);
        wasm::Literal::operator=(&local_48->value,&local_68);
        wasm::Literal::~Literal(&local_68);
        local_80 = (local_48->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.
                   type.id;
        BVar3 = Abstract::getBinary((Type)local_80,Add);
        *(BinaryOp *)(swap.binary + 2) = BVar3;
      }
      else {
        BVar3 = *(BinaryOp *)(swap.binary + 2);
        local_88 = (local_48->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.
                   type.id;
        BVar2 = Abstract::getBinary((Type)local_88,GtS);
        if ((BVar3 == BVar2) && (iVar5 = wasm::Literal::getInteger(&local_48->value), iVar5 == -1))
        {
          local_90 = (local_48->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression
                     .type.id;
          BVar3 = Abstract::getBinary((Type)local_90,GeS);
          *(BinaryOp *)(swap.binary + 2) = BVar3;
          local_b0 = (local_48->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression
                     .type.id;
          wasm::Literal::makeZero(&local_a8,(Type)local_b0);
          wasm::Literal::operator=(&local_48->value,&local_a8);
          wasm::Literal::~Literal(&local_a8);
        }
        else {
          BVar3 = *(BinaryOp *)(swap.binary + 2);
          local_b8 = (local_48->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression
                     .type.id;
          BVar2 = Abstract::getBinary((Type)local_b8,LeS);
          if ((BVar3 == BVar2) && (iVar5 = wasm::Literal::getInteger(&local_48->value), iVar5 == -1)
             ) {
            local_c0 = (local_48->super_SpecificExpression<(wasm::Expression::Id)14>).
                       super_Expression.type.id;
            BVar3 = Abstract::getBinary((Type)local_c0,LtS);
            *(BinaryOp *)(swap.binary + 2) = BVar3;
            local_e0 = (local_48->super_SpecificExpression<(wasm::Expression::Id)14>).
                       super_Expression.type.id;
            wasm::Literal::makeZero(&local_d8,(Type)local_e0);
            wasm::Literal::operator=(&local_48->value,&local_d8);
            wasm::Literal::~Literal(&local_d8);
          }
          else {
            BVar3 = *(BinaryOp *)(swap.binary + 2);
            local_e8 = (local_48->super_SpecificExpression<(wasm::Expression::Id)14>).
                       super_Expression.type.id;
            BVar2 = Abstract::getBinary((Type)local_e8,LtS);
            if ((BVar3 == BVar2) &&
               (iVar5 = wasm::Literal::getInteger(&local_48->value), iVar5 == 1)) {
              local_f0 = (local_48->super_SpecificExpression<(wasm::Expression::Id)14>).
                         super_Expression.type.id;
              BVar3 = Abstract::getBinary((Type)local_f0,LeS);
              *(BinaryOp *)(swap.binary + 2) = BVar3;
              local_110 = (local_48->super_SpecificExpression<(wasm::Expression::Id)14>).
                          super_Expression.type.id;
              wasm::Literal::makeZero(&local_108,(Type)local_110);
              wasm::Literal::operator=(&local_48->value,&local_108);
              wasm::Literal::~Literal(&local_108);
            }
            else {
              BVar3 = *(BinaryOp *)(swap.binary + 2);
              local_118 = (local_48->super_SpecificExpression<(wasm::Expression::Id)14>).
                          super_Expression.type.id;
              BVar2 = Abstract::getBinary((Type)local_118,GeS);
              if ((BVar3 == BVar2) &&
                 (iVar5 = wasm::Literal::getInteger(&local_48->value), iVar5 == 1)) {
                local_120 = (local_48->super_SpecificExpression<(wasm::Expression::Id)14>).
                            super_Expression.type.id;
                BVar3 = Abstract::getBinary((Type)local_120,GtS);
                *(BinaryOp *)(swap.binary + 2) = BVar3;
                local_140 = (local_48->super_SpecificExpression<(wasm::Expression::Id)14>).
                            super_Expression.type.id;
                wasm::Literal::makeZero(&local_138,(Type)local_140);
                wasm::Literal::operator=(&local_48->value,&local_138);
                wasm::Literal::~Literal(&local_138);
              }
              else {
                BVar3 = *(BinaryOp *)(swap.binary + 2);
                local_148 = (local_48->super_SpecificExpression<(wasm::Expression::Id)14>).
                            super_Expression.type.id;
                BVar2 = Abstract::getBinary((Type)local_148,LtU);
                if ((BVar3 == BVar2) &&
                   (iVar5 = wasm::Literal::getInteger(&local_48->value), iVar5 == 1)) {
                  local_150 = (local_48->super_SpecificExpression<(wasm::Expression::Id)14>).
                              super_Expression.type.id;
                  BVar3 = Abstract::getBinary((Type)local_150,Eq);
                  *(BinaryOp *)(swap.binary + 2) = BVar3;
                  local_170 = (local_48->super_SpecificExpression<(wasm::Expression::Id)14>).
                              super_Expression.type.id;
                  wasm::Literal::makeZero(&local_168,(Type)local_170);
                  wasm::Literal::operator=(&local_48->value,&local_168);
                  wasm::Literal::~Literal(&local_168);
                }
                else {
                  BVar3 = *(BinaryOp *)(swap.binary + 2);
                  local_178 = (local_48->super_SpecificExpression<(wasm::Expression::Id)14>).
                              super_Expression.type.id;
                  BVar2 = Abstract::getBinary((Type)local_178,GeU);
                  if ((BVar3 == BVar2) &&
                     (iVar5 = wasm::Literal::getInteger(&local_48->value), iVar5 == 1)) {
                    local_180 = (local_48->super_SpecificExpression<(wasm::Expression::Id)14>).
                                super_Expression.type.id;
                    BVar3 = Abstract::getBinary((Type)local_180,Ne);
                    *(BinaryOp *)(swap.binary + 2) = BVar3;
                    local_1a0 = (local_48->super_SpecificExpression<(wasm::Expression::Id)14>).
                                super_Expression.type.id;
                    wasm::Literal::makeZero(&local_198,(Type)local_1a0);
                    wasm::Literal::operator=(&local_48->value,&local_198);
                    wasm::Literal::~Literal(&local_198);
                  }
                  else if ((*(int *)(swap.binary + 2) == 0x11) &&
                          (iVar4 = wasm::Literal::geti32(&local_48->value), iVar4 == -0x7fffffff)) {
                    *(undefined4 *)(swap.binary + 2) = 0xf;
                    wasm::Type::Type(&local_1c0,i32);
                    wasm::Literal::makeSignedMin(&local_1b8,local_1c0);
                    wasm::Literal::operator=(&local_48->value,&local_1b8);
                    wasm::Literal::~Literal(&local_1b8);
                  }
                  else if ((*(int *)(swap.binary + 2) == 0x2a) &&
                          (iVar5 = wasm::Literal::geti64(&local_48->value),
                          iVar5 == -0x7fffffffffffffff)) {
                    *(undefined4 *)(swap.binary + 2) = 0x28;
                    wasm::Type::Type(&local_1e0,i64);
                    wasm::Literal::makeSignedMin(&local_1d8,local_1e0);
                    wasm::Literal::operator=(&local_48->value,&local_1d8);
                    wasm::Literal::~Literal(&local_1d8);
                  }
                  else if ((*(int *)(swap.binary + 2) == 0x17) &&
                          (iVar4 = wasm::Literal::geti32(&local_48->value), iVar4 == -0x7fffffff)) {
                    *(undefined4 *)(swap.binary + 2) = 0x10;
                    wasm::Type::Type(&local_200,i32);
                    wasm::Literal::makeSignedMin(&local_1f8,local_200);
                    wasm::Literal::operator=(&local_48->value,&local_1f8);
                    wasm::Literal::~Literal(&local_1f8);
                  }
                  else if ((*(int *)(swap.binary + 2) == 0x30) &&
                          (iVar5 = wasm::Literal::geti64(&local_48->value),
                          iVar5 == -0x7fffffffffffffff)) {
                    *(undefined4 *)(swap.binary + 2) = 0x29;
                    wasm::Type::Type(&local_220,i64);
                    wasm::Literal::makeSignedMin(&local_218,local_220);
                    wasm::Literal::operator=(&local_48->value,&local_218);
                    wasm::Literal::~Literal(&local_218);
                  }
                  else if ((*(int *)(swap.binary + 2) == 0x15) &&
                          (iVar4 = wasm::Literal::geti32(&local_48->value), iVar4 == 0x7ffffffe)) {
                    *(undefined4 *)(swap.binary + 2) = 0xf;
                    wasm::Type::Type(&local_240,i32);
                    wasm::Literal::makeSignedMax(&local_238,local_240);
                    wasm::Literal::operator=(&local_48->value,&local_238);
                    wasm::Literal::~Literal(&local_238);
                  }
                  else if ((*(int *)(swap.binary + 2) == 0x2e) &&
                          (iVar5 = wasm::Literal::geti64(&local_48->value),
                          iVar5 == 0x7ffffffffffffffe)) {
                    *(undefined4 *)(swap.binary + 2) = 0x28;
                    wasm::Type::Type(&local_260,i64);
                    wasm::Literal::makeSignedMax(&local_258,local_260);
                    wasm::Literal::operator=(&local_48->value,&local_258);
                    wasm::Literal::~Literal(&local_258);
                  }
                  else if ((*(int *)(swap.binary + 2) == 0x13) &&
                          (iVar4 = wasm::Literal::geti32(&local_48->value), iVar4 == 0x7ffffffe)) {
                    *(undefined4 *)(swap.binary + 2) = 0x10;
                    wasm::Type::Type(&local_280,i32);
                    wasm::Literal::makeSignedMax(&local_278,local_280);
                    wasm::Literal::operator=(&local_48->value,&local_278);
                    wasm::Literal::~Literal(&local_278);
                  }
                  else if ((*(int *)(swap.binary + 2) == 0x2c) &&
                          (iVar5 = wasm::Literal::geti64(&local_48->value),
                          iVar5 == 0x7ffffffffffffffe)) {
                    *(undefined4 *)(swap.binary + 2) = 0x29;
                    wasm::Type::Type(&local_2a0,i64);
                    wasm::Literal::makeSignedMax(&local_298,local_2a0);
                    wasm::Literal::operator=(&local_48->value,&local_298);
                    wasm::Literal::~Literal(&local_298);
                  }
                  else {
                    BVar3 = *(BinaryOp *)(swap.binary + 2);
                    local_2a8 = (local_48->super_SpecificExpression<(wasm::Expression::Id)14>).
                                super_Expression.type.id;
                    BVar2 = Abstract::getBinary((Type)local_2a8,LeU);
                    if ((BVar3 == BVar2) &&
                       (iVar5 = wasm::Literal::getInteger(&local_48->value), iVar5 == -2)) {
                      local_2b0 = (local_48->super_SpecificExpression<(wasm::Expression::Id)14>).
                                  super_Expression.type.id;
                      BVar3 = Abstract::getBinary((Type)local_2b0,Ne);
                      *(BinaryOp *)(swap.binary + 2) = BVar3;
                      local_2d0 = (local_48->super_SpecificExpression<(wasm::Expression::Id)14>).
                                  super_Expression.type.id;
                      wasm::Literal::makeUnsignedMax(&local_2c8,(Type)local_2d0);
                      wasm::Literal::operator=(&local_48->value,&local_2c8);
                      wasm::Literal::~Literal(&local_2c8);
                    }
                    else {
                      BVar3 = *(BinaryOp *)(swap.binary + 2);
                      local_2d8 = (local_48->super_SpecificExpression<(wasm::Expression::Id)14>).
                                  super_Expression.type.id;
                      BVar2 = Abstract::getBinary((Type)local_2d8,GtU);
                      if ((BVar3 == BVar2) &&
                         (iVar5 = wasm::Literal::getInteger(&local_48->value), iVar5 == -2)) {
                        local_2e0 = (local_48->super_SpecificExpression<(wasm::Expression::Id)14>).
                                    super_Expression.type.id;
                        BVar3 = Abstract::getBinary((Type)local_2e0,Eq);
                        *(BinaryOp *)(swap.binary + 2) = BVar3;
                        wasm::Literal::makeUnsignedMax
                                  (&local_2f8,
                                   (Type)(local_48->
                                         super_SpecificExpression<(wasm::Expression::Id)14>).
                                         super_Expression.type.id);
                        wasm::Literal::operator=(&local_48->value,&local_2f8);
                        wasm::Literal::~Literal(&local_2f8);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    return;
  }
  __assert_fail("shouldCanonicalize(binary)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp"
                ,0xa97,"void wasm::OptimizeInstructions::canonicalize(Binary *)");
}

Assistant:

void canonicalize(Binary* binary) {
    assert(shouldCanonicalize(binary));
    auto swap = [&]() {
      assert(canReorder(binary->left, binary->right));
      if (binary->isRelational()) {
        binary->op = reverseRelationalOp(binary->op);
      }
      std::swap(binary->left, binary->right);
    };
    auto maybeSwap = [&]() {
      if (canReorder(binary->left, binary->right)) {
        swap();
      }
    };
    // Prefer a const on the right.
    if (binary->left->is<Const>() && !binary->right->is<Const>()) {
      swap();
    }
    if (auto* c = binary->right->dynCast<Const>()) {
      // x - C   ==>   x + (-C)
      // Prefer use addition if there is a constant on the right.
      if (binary->op == Abstract::getBinary(c->type, Abstract::Sub)) {
        c->value = c->value.neg();
        binary->op = Abstract::getBinary(c->type, Abstract::Add);
        return;
      }
      // Prefer to compare to 0 instead of to -1 or 1.
      // (signed)x > -1   ==>   x >= 0
      if (binary->op == Abstract::getBinary(c->type, Abstract::GtS) &&
          c->value.getInteger() == -1LL) {
        binary->op = Abstract::getBinary(c->type, Abstract::GeS);
        c->value = Literal::makeZero(c->type);
        return;
      }
      // (signed)x <= -1   ==>   x < 0
      if (binary->op == Abstract::getBinary(c->type, Abstract::LeS) &&
          c->value.getInteger() == -1LL) {
        binary->op = Abstract::getBinary(c->type, Abstract::LtS);
        c->value = Literal::makeZero(c->type);
        return;
      }
      // (signed)x < 1   ==>   x <= 0
      if (binary->op == Abstract::getBinary(c->type, Abstract::LtS) &&
          c->value.getInteger() == 1LL) {
        binary->op = Abstract::getBinary(c->type, Abstract::LeS);
        c->value = Literal::makeZero(c->type);
        return;
      }
      // (signed)x >= 1   ==>   x > 0
      if (binary->op == Abstract::getBinary(c->type, Abstract::GeS) &&
          c->value.getInteger() == 1LL) {
        binary->op = Abstract::getBinary(c->type, Abstract::GtS);
        c->value = Literal::makeZero(c->type);
        return;
      }
      // (unsigned)x < 1   ==>   x == 0
      if (binary->op == Abstract::getBinary(c->type, Abstract::LtU) &&
          c->value.getInteger() == 1LL) {
        binary->op = Abstract::getBinary(c->type, Abstract::Eq);
        c->value = Literal::makeZero(c->type);
        return;
      }
      // (unsigned)x >= 1   ==>   x != 0
      if (binary->op == Abstract::getBinary(c->type, Abstract::GeU) &&
          c->value.getInteger() == 1LL) {
        binary->op = Abstract::getBinary(c->type, Abstract::Ne);
        c->value = Literal::makeZero(c->type);
        return;
      }
      // Prefer compare to signed min (s_min) instead of s_min + 1.
      // (signed)x < s_min + 1   ==>   x == s_min
      if (binary->op == LtSInt32 && c->value.geti32() == INT32_MIN + 1) {
        binary->op = EqInt32;
        c->value = Literal::makeSignedMin(Type::i32);
        return;
      }
      if (binary->op == LtSInt64 && c->value.geti64() == INT64_MIN + 1) {
        binary->op = EqInt64;
        c->value = Literal::makeSignedMin(Type::i64);
        return;
      }
      // (signed)x >= s_min + 1   ==>   x != s_min
      if (binary->op == GeSInt32 && c->value.geti32() == INT32_MIN + 1) {
        binary->op = NeInt32;
        c->value = Literal::makeSignedMin(Type::i32);
        return;
      }
      if (binary->op == GeSInt64 && c->value.geti64() == INT64_MIN + 1) {
        binary->op = NeInt64;
        c->value = Literal::makeSignedMin(Type::i64);
        return;
      }
      // Prefer compare to signed max (s_max) instead of s_max - 1.
      // (signed)x > s_max - 1   ==>   x == s_max
      if (binary->op == GtSInt32 && c->value.geti32() == INT32_MAX - 1) {
        binary->op = EqInt32;
        c->value = Literal::makeSignedMax(Type::i32);
        return;
      }
      if (binary->op == GtSInt64 && c->value.geti64() == INT64_MAX - 1) {
        binary->op = EqInt64;
        c->value = Literal::makeSignedMax(Type::i64);
        return;
      }
      // (signed)x <= s_max - 1   ==>   x != s_max
      if (binary->op == LeSInt32 && c->value.geti32() == INT32_MAX - 1) {
        binary->op = NeInt32;
        c->value = Literal::makeSignedMax(Type::i32);
        return;
      }
      if (binary->op == LeSInt64 && c->value.geti64() == INT64_MAX - 1) {
        binary->op = NeInt64;
        c->value = Literal::makeSignedMax(Type::i64);
        return;
      }
      // Prefer compare to unsigned max (u_max) instead of u_max - 1.
      // (unsigned)x <= u_max - 1   ==>   x != u_max
      if (binary->op == Abstract::getBinary(c->type, Abstract::LeU) &&
          c->value.getInteger() == (int64_t)(UINT64_MAX - 1)) {
        binary->op = Abstract::getBinary(c->type, Abstract::Ne);
        c->value = Literal::makeUnsignedMax(c->type);
        return;
      }
      // (unsigned)x > u_max - 1   ==>   x == u_max
      if (binary->op == Abstract::getBinary(c->type, Abstract::GtU) &&
          c->value.getInteger() == (int64_t)(UINT64_MAX - 1)) {
        binary->op = Abstract::getBinary(c->type, Abstract::Eq);
        c->value = Literal::makeUnsignedMax(c->type);
        return;
      }
      return;
    }
    // Prefer a get on the right.
    if (binary->left->is<LocalGet>() && !binary->right->is<LocalGet>()) {
      return maybeSwap();
    }
    // Sort by the node id type, if different.
    if (binary->left->_id != binary->right->_id) {
      if (binary->left->_id > binary->right->_id) {
        return maybeSwap();
      }
      return;
    }
    // If the children have the same node id, we have to go deeper.
    if (auto* left = binary->left->dynCast<Unary>()) {
      auto* right = binary->right->cast<Unary>();
      if (left->op > right->op) {
        return maybeSwap();
      }
    }
    if (auto* left = binary->left->dynCast<Binary>()) {
      auto* right = binary->right->cast<Binary>();
      if (left->op > right->op) {
        return maybeSwap();
      }
    }
    if (auto* left = binary->left->dynCast<LocalGet>()) {
      auto* right = binary->right->cast<LocalGet>();
      if (left->index > right->index) {
        return maybeSwap();
      }
    }
  }